

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_property
          (t_netstd_generator *this,ostream *out,t_field *tfield,bool isPublic,bool generateIsset,
          string *fieldPrefix)

{
  int *piVar1;
  ostream *poVar2;
  char *pcVar3;
  t_netstd_generator *this_00;
  undefined3 in_register_00000081;
  string *__rhs;
  string sStack_b8;
  string local_98;
  undefined4 local_74;
  string local_70;
  string local_50;
  
  local_74 = CONCAT31(in_register_00000081,generateIsset);
  if (this->serialize_ == false) {
    if ((this->wcf_ & isPublic) == 0) goto LAB_0025951f;
  }
  else if (!isPublic) goto LAB_0025951f;
  t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&sStack_b8);
  poVar2 = std::operator<<(poVar2,"[DataMember(Order = 0)]");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_b8);
LAB_0025951f:
  t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&sStack_b8);
  pcVar3 = "private ";
  if (isPublic) {
    pcVar3 = "public ";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  type_name_abi_cxx11_(&local_98,this,tfield->type_,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  poVar2 = std::operator<<(poVar2," ");
  prop_name_abi_cxx11_(&local_70,this,tfield,false);
  std::operator<<(poVar2,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_b8);
  if (tfield->req_ == T_REQUIRED) {
    poVar2 = std::operator<<(out," { get; set; }");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar2 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"get");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"return ");
    __rhs = &tfield->name_;
    std::operator+(&local_98,fieldPrefix,__rhs);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"}");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    poVar2 = std::operator<<(poVar2,"set");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if ((char)local_74 != '\0') {
      t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&sStack_b8);
      poVar2 = std::operator<<(poVar2,"__isset.");
      std::__cxx11::string::string((string *)&local_50,(string *)__rhs);
      this_00 = this;
      normalize_name(&local_70,this,&local_50,false);
      get_isset_name(&local_98,this_00,&local_70);
      poVar2 = std::operator<<(poVar2,(string *)&local_98);
      poVar2 = std::operator<<(poVar2," = true;");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&sStack_b8);
    }
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"this.");
    std::operator+(&local_98,fieldPrefix,__rhs);
    poVar2 = std::operator<<(poVar2,(string *)&local_98);
    poVar2 = std::operator<<(poVar2," = value;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_b8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&sStack_b8,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&sStack_b8);
    poVar2 = std::operator<<(poVar2,"}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_b8);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_property(ostream& out, t_field* tfield, bool isPublic, bool generateIsset, string fieldPrefix)
{
    if ((is_serialize_enabled() || is_wcf_enabled()) && isPublic)
    {
        out << indent() << "[DataMember(Order = 0)]" << endl;
    }
    out << indent() << (isPublic ? "public " : "private ") << type_name(tfield->get_type()) << " " << prop_name(tfield);

    bool is_required = field_is_required(tfield);
    if (is_required)
    {
        out << " { get; set; }" << endl;
    }
    else
    {
        out << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "get" << endl
            << indent() << "{" << endl;
        indent_up();

        out << indent() << "return " << fieldPrefix + tfield->get_name() << ";" << endl;
        indent_down();
        out << indent() << "}" << endl
            << indent() << "set" << endl
            << indent() << "{" << endl;
        indent_up();

        if (generateIsset)
        {
            out << indent() << "__isset." << get_isset_name(normalize_name(tfield->get_name())) << " = true;" << endl;
        }
        out << indent() << "this." << fieldPrefix + tfield->get_name() << " = value;" << endl;

        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl;
    }
    out << endl;
}